

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<std::filesystem::__cxx11::path>::
emplace_back<std::filesystem::__cxx11::path_const&>
          (SmallVectorBase<std::filesystem::__cxx11::path> *this,path *args)

{
  path *in_RSI;
  SmallVectorBase<std::filesystem::__cxx11::path> *in_RDI;
  path *in_stack_00000020;
  pointer in_stack_00000028;
  SmallVectorBase<std::filesystem::__cxx11::path> *in_stack_00000030;
  SmallVectorBase<std::filesystem::__cxx11::path> *this_00;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    end(in_RDI);
    local_8 = emplaceRealloc<std::filesystem::__cxx11::path_const&>
                        (in_stack_00000030,in_stack_00000028,in_stack_00000020);
  }
  else {
    this_00 = in_RDI;
    end(in_RDI);
    std::filesystem::__cxx11::path::path((path *)this_00,in_RSI);
    in_RDI->len = in_RDI->len + 1;
    local_8 = back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }